

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SurfaceDiffusion.cpp
# Opt level: O0

void __thiscall
OpenMD::SurfaceDiffusion::SurfaceDiffusion
          (SurfaceDiffusion *this,SimInfo *info,string *filename,string *sele,RealType param_5)

{
  undefined1 uVar1;
  int iVar2;
  ostream *poVar3;
  SelectionEvaluator *in_RCX;
  string *in_RDX;
  undefined8 *in_RDI;
  SimInfo *in_XMM0_Qa;
  SimInfo *in_stack_00000188;
  SelectionManager *in_stack_00000190;
  undefined8 in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  StaticAnalyser *in_stack_fffffffffffffef0;
  SelectionManager *this_00;
  undefined7 in_stack_fffffffffffffef8;
  string *this_01;
  SelectionEvaluator *this_02;
  string *script;
  SelectionEvaluator *this_03;
  
  StaticAnalyser::StaticAnalyser
            (in_stack_fffffffffffffef0,
             (SimInfo *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             in_stack_fffffffffffffee0,(uint)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  *in_RDI = &PTR__SurfaceDiffusion_00560340;
  std::__cxx11::string::string((string *)(in_RDI + 0x1b),(string *)in_RCX);
  SelectionEvaluator::SelectionEvaluator(in_RCX,in_XMM0_Qa);
  SelectionManager::SelectionManager(in_stack_00000190,in_stack_00000188);
  this_01 = (string *)(in_RDI + 0xe2);
  std::__cxx11::string::string(this_01);
  std::
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ::vector((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
            *)0x1d33d8);
  std::
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ::vector((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
            *)0x1d33f1);
  this_02 = (SelectionEvaluator *)(in_RDI + 0xef);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            *)0x1d340a);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            *)0x1d3423);
  script = (string *)(in_RDI + 0xf5);
  std::
  vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
  ::vector((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
            *)0x1d343c);
  this_03 = (SelectionEvaluator *)(in_RDI + 0xf8);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x1d3455);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x1d346e);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x1d3487);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x1d34a0)
  ;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x1d34b9)
  ;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1d34d5);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1d34f1);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1d350d);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1d3529);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1d3545);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1d3561);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1d357d);
  SelectionEvaluator::loadScriptString(this_03,script);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1f));
  if (!(bool)uVar1) {
    this_00 = (SelectionManager *)(in_RDI + 0xc9);
    SelectionEvaluator::evaluate(this_02);
    SelectionManager::setSelectionSet
              (this_00,(SelectionSet *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
              );
    SelectionSet::~SelectionSet((SelectionSet *)0x1d3610);
  }
  iVar2 = SelectionManager::getSelectionCount((SelectionManager *)0x1d36b3);
  *(int *)((long)in_RDI + 0x734) = iVar2;
  poVar3 = std::operator<<((ostream *)&std::cout,"SelectionCount_: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)in_RDI + 0x734));
  std::operator<<(poVar3,"\n");
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::resize((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            *)this_01,CONCAT17(uVar1,in_stack_fffffffffffffef8));
  std::
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ::resize((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
            *)this_01,CONCAT17(uVar1,in_stack_fffffffffffffef8));
  std::__cxx11::string::operator=((string *)(in_RDI + 0xe2),in_RDX);
  in_RDI[0xe7] = 0x4000000000000000;
  return;
}

Assistant:

SurfaceDiffusion::SurfaceDiffusion(SimInfo* info, const std::string& filename,
                                     const std::string& sele, RealType) :
      StaticAnalyser(info, filename, 1),
      selectionScript_(sele), evaluator_(info), seleMan1_(info) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator_.evaluate());
    }

    // Depending on the selection 'sele1="select Pt"' need a vector equal to the
    // number of Platinums in the system (for this specific case)
    selectionCount_ = seleMan1_.getSelectionCount();
    cout << "SelectionCount_: " << selectionCount_ << "\n";

    moBool_.resize(selectionCount_);
    positions_.resize(selectionCount_);

    filename_           = filename;
    singleMoveDistance_ = 2.0;
  }